

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

bool __thiscall position::is_draw(position *this)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((this->ifo).move50 < 100) {
    uVar1 = (uint)this->hidx;
    bVar2 = false;
    while ((uVar1 = uVar1 - 2, !bVar2 && ((uVar1 & 0x80000000) == 0))) {
      bVar2 = (this->ifo).repkey == this->history[uVar1 & 0x7fffffff].repkey;
    }
  }
  return bVar2;
}

Assistant:

bool position::is_draw() {

	if (ifo.move50 > 99) 
		return true;

	U64 kcurrent = ifo.repkey;
	unsigned same_count = 0;
	int idx = hidx - 2;
	while (same_count == 0 && idx >= 0) {
		same_count += (kcurrent == history[idx].repkey);
		idx -= 2;
	}

	return same_count > 0;
}